

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-dark.c
# Opt level: O0

_Bool borg_flow_dark_2(int b_stair)

{
  int iVar1;
  _Bool _Var2;
  wchar_t y_00;
  wchar_t x_00;
  borg_grid *ag;
  int y;
  int x;
  int r;
  int i;
  int b_stair_local;
  
  if (borg.trait[0x69] == 0) {
    i._3_1_ = false;
  }
  else {
    iVar1 = borg.trait[0x1a];
    borg_temp_n = 0;
    for (x = 0; x < 4; x = x + 1) {
      y_00 = borg.c.y + (int)ddy_ddd[x] * (iVar1 + 1);
      x_00 = borg.c.x + (int)ddx_ddd[x] * (iVar1 + 1);
      if (((((L'\0' < y_00) && (L'\0' < x_00)) && (y_00 < L'A')) &&
          ((x_00 < L'Å' && (borg_grids[y_00][x_00].feat == '\0')))) &&
         (((borg_grids[y_00][x_00].info & 0x20) != 0 &&
          (_Var2 = borg_flow_far_from_stairs(x_00,y_00,b_stair), !_Var2)))) {
        borg_temp_x[borg_temp_n] = (uint8_t)x_00;
        borg_temp_y[borg_temp_n] = (uint8_t)y_00;
        borg_temp_n = borg_temp_n + 1;
      }
    }
    if (borg_temp_n == 0) {
      i._3_1_ = false;
    }
    else {
      if (((borg.goal.ignoring & 1U) != 0) || ((scaryguy_on_level & 1U) != 0)) {
        borg_danger_wipe = true;
      }
      borg_flow_clear();
      for (x = 0; x < borg_temp_n; x = x + 1) {
        borg_flow_direct((uint)borg_temp_y[x],(uint)borg_temp_x[x]);
      }
      _Var2 = borg_flow_commit((char *)0x0,L'\x04');
      if (_Var2) {
        _Var2 = borg_flow_old(L'\x04');
        if (_Var2) {
          i._3_1_ = true;
        }
        else {
          i._3_1_ = false;
        }
      }
      else {
        i._3_1_ = false;
      }
    }
  }
  return i._3_1_;
}

Assistant:

static bool borg_flow_dark_2(int b_stair)
{
    int i, r;
    int x, y;

    borg_grid *ag;

    /* Hack -- not in town */
    if (!borg.trait[BI_CDEPTH])
        return false;

    /* Maximal radius */
    r = borg.trait[BI_LIGHT] + 1;

    /* Reset */
    borg_temp_n = 0;

    /* Four directions */
    for (i = 0; i < 4; i++) {
        y = borg.c.y + ddy_ddd[i] * r;
        x = borg.c.x + ddx_ddd[i] * r;

        /* Check legality */
        if (y < 1)
            continue;
        if (x < 1)
            continue;
        if (y > AUTO_MAX_Y - 2)
            continue;
        if (x > AUTO_MAX_X - 2)
            continue;

        /* Acquire grid */
        ag = &borg_grids[y][x];

        /* Require unknown */
        if (ag->feat != FEAT_NONE)
            continue;

        /* Require viewable */
        if (!(ag->info & BORG_VIEW))
            continue;

        /* don't go too far from the stairs */
        if (borg_flow_far_from_stairs(x, y, b_stair))
            continue;

        /* Careful -- Remember it */
        borg_temp_x[borg_temp_n] = x;
        borg_temp_y[borg_temp_n] = y;
        borg_temp_n++;
    }

    /* Nothing */
    if (!borg_temp_n)
        return false;

    /* Wipe icky codes from grids if needed */
    if (borg.goal.ignoring || scaryguy_on_level)
        borg_danger_wipe = true;

    /* Clear the flow codes */
    borg_flow_clear();

    /* Create paths to useful grids */
    for (i = 0; i < borg_temp_n; i++) {
        y = borg_temp_y[i];
        x = borg_temp_x[i];

        /* Create a path */
        borg_flow_direct(y, x);
    }

    /* Attempt to Commit the flow */
    if (!borg_flow_commit(NULL, GOAL_DARK))
        return false;

    /* Take one step */
    if (!borg_flow_old(GOAL_DARK))
        return false;

    /* Forget goal */
    /* goal = 0; */

    /* Success */
    return true;
}